

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide_device.cpp
# Opt level: O0

void embree::renderTileStandard
               (int taskIndex,int threadIndex,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,int numTilesX,int numTilesY)

{
  uint in_ECX;
  long in_RDX;
  int in_EDI;
  uint in_R8D;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  float in_stack_00000010;
  float in_stack_00000014;
  uint b;
  uint g;
  uint r;
  Vec3fa color;
  uint x;
  uint y;
  uint y1;
  uint y0;
  uint x1;
  uint x0;
  uint tileX;
  uint tileY;
  int t;
  float local_12c;
  float local_128;
  float local_124;
  float local_120;
  float local_11c;
  float local_118;
  uint local_114;
  uint local_110;
  undefined4 local_10c;
  undefined4 local_108;
  int local_104;
  undefined4 local_100;
  undefined4 local_fc;
  int local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  int local_ec;
  float local_e8;
  float local_e4;
  float local_e0 [3];
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  int local_bc;
  int local_b8;
  uint local_9c;
  long local_98;
  uint local_84;
  uint local_7c;
  undefined4 *local_78;
  undefined4 *local_70;
  float *local_68;
  undefined4 *local_60;
  undefined4 *local_58;
  float *local_50;
  undefined4 *local_48;
  undefined4 *local_40;
  float *local_38;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_10;
  float local_8;
  
  local_b8 = in_EDI / in_stack_00000008;
  local_bc = in_EDI - local_b8 * in_stack_00000008;
  local_c0 = local_bc * 8;
  local_7c = local_c0 + 8;
  local_110 = in_ECX;
  if (local_7c < in_ECX) {
    local_110 = local_7c;
  }
  local_c4 = local_110;
  local_d0 = local_b8 * 8;
  local_84 = local_d0 + 8;
  local_114 = in_R8D;
  if (local_84 < in_R8D) {
    local_114 = local_84;
  }
  local_cc = local_114;
  local_c8 = local_d0;
  local_9c = in_ECX;
  local_98 = in_RDX;
  for (; local_d0 < local_cc; local_d0 = local_d0 + 1) {
    for (local_d4 = local_c0; local_d4 < local_c4; local_d4 = local_d4 + 1) {
      renderPixelStandard(in_stack_00000014,in_stack_00000010,
                          (ISPCCamera *)CONCAT44(in_stack_0000000c,in_stack_00000008));
      local_38 = &local_e8;
      local_f0 = 0;
      local_f4 = 0x3f800000;
      local_40 = &local_f0;
      local_48 = &local_f4;
      local_18 = 1.0;
      local_118 = local_18;
      if (local_e8 < 1.0) {
        local_118 = local_e8;
      }
      local_2c = local_118;
      local_30 = 0.0;
      local_11c = local_30;
      if (0.0 <= local_118) {
        local_11c = local_118;
      }
      local_ec = (int)(long)(local_11c * 255.0);
      local_50 = &local_e4;
      local_fc = 0;
      local_100 = 0x3f800000;
      local_58 = &local_fc;
      local_60 = &local_100;
      local_10 = 1.0;
      local_120 = local_10;
      if (local_e4 < 1.0) {
        local_120 = local_e4;
      }
      local_24 = local_120;
      local_28 = 0.0;
      local_124 = local_28;
      if (0.0 <= local_120) {
        local_124 = local_120;
      }
      local_f8 = (int)(long)(local_124 * 255.0);
      local_68 = local_e0;
      local_108 = 0;
      local_10c = 0x3f800000;
      local_70 = &local_108;
      local_78 = &local_10c;
      local_8 = 1.0;
      local_128 = local_8;
      if (local_e0[0] < 1.0) {
        local_128 = local_e0[0];
      }
      local_1c = local_128;
      local_20 = 0.0;
      local_12c = local_20;
      if (0.0 <= local_128) {
        local_12c = local_128;
      }
      local_104 = (int)(long)(local_12c * 255.0);
      *(int *)(local_98 + (ulong)(local_d0 * local_9c + local_d4) * 4) =
           local_104 * 0x10000 + local_f8 * 0x100 + local_ec;
    }
  }
  return;
}

Assistant:

void renderTileStandard(int taskIndex,
                        int threadIndex,
                        int* pixels,
                        const unsigned int width,
                        const unsigned int height,
                        const float time,
                        const ISPCCamera& camera,
                        const int numTilesX,
                        const int numTilesY)
{
  const int t = taskIndex;
  const unsigned int tileY = t / numTilesX;
  const unsigned int tileX = t - tileY * numTilesX;
  const unsigned int x0 = tileX * TILE_SIZE_X;
  const unsigned int x1 = min(x0+TILE_SIZE_X,width);
  const unsigned int y0 = tileY * TILE_SIZE_Y;
  const unsigned int y1 = min(y0+TILE_SIZE_Y,height);

  for (unsigned int y=y0; y<y1; y++) for (unsigned int x=x0; x<x1; x++)
  {
    Vec3fa color = renderPixelStandard((float)x,(float)y,camera);

    /* write color to framebuffer */
    unsigned int r = (unsigned int) (255.0f * clamp(color.x,0.0f,1.0f));
    unsigned int g = (unsigned int) (255.0f * clamp(color.y,0.0f,1.0f));
    unsigned int b = (unsigned int) (255.0f * clamp(color.z,0.0f,1.0f));
    pixels[y*width+x] = (b << 16) + (g << 8) + r;
  }
}